

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

void __thiscall
spvtools::val::ValidationState_t::RegisterCapability(ValidationState_t *this,Capability cap)

{
  uint uVar1;
  bool bVar2;
  spv_result_t sVar3;
  Capability cap_00;
  long lVar4;
  Capability cap_local;
  spv_operand_desc desc;
  iterator __begin3;
  EnumSet<spv::Capability> local_40;
  
  cap_local = cap;
  bVar2 = EnumSet<spv::Capability>::contains(&this->module_capabilities_,cap);
  if (bVar2) {
    return;
  }
  EnumSet<spv::Capability>::insert
            ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&local_40,
             &this->module_capabilities_,&cap_local);
  sVar3 = AssemblyGrammar::lookupOperand
                    (&this->grammar_,SPV_OPERAND_TYPE_CAPABILITY,cap_local,&desc);
  if (sVar3 == SPV_SUCCESS) {
    EnumSet<spv::Capability>::EnumSet(&local_40,desc->numCapabilities,desc->capabilities);
    EnumSet<spv::Capability>::cbegin(&__begin3,&local_40);
    while (((__begin3.set_ != &local_40 || (__begin3.bucketOffset_ != 0)) ||
           (__begin3.bucketIndex_ !=
            (long)local_40.buckets_.
                  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_40.buckets_.
                  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4))) {
      cap_00 = EnumSet<spv::Capability>::Iterator::operator*(&__begin3);
      RegisterCapability(this,cap_00);
      EnumSet<spv::Capability>::Iterator::operator++(&__begin3);
    }
    std::
    _Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
    ::~_Vector_base((_Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                     *)&local_40);
  }
  uVar1 = cap_local - WorkgroupMemoryExplicitLayout8BitAccessKHR;
  if (uVar1 < 0x16) {
    if ((0xf2U >> (uVar1 & 0x1f) & 1) != 0) {
      (this->features_).declare_int16_type = true;
      (this->features_).declare_float16_type = true;
      lVar4 = 0x46b;
      goto LAB_002a9dde;
    }
    if ((0x380001U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x3000U >> (uVar1 & 0x1f) & 1) != 0) {
        lVar4 = 0x46c;
        goto LAB_002a9dde;
      }
      goto LAB_002a9dab;
    }
  }
  else {
LAB_002a9dab:
    if (cap_local - Float16Buffer < 2) {
      lVar4 = 0x46a;
      goto LAB_002a9dde;
    }
    if (cap_local == Kernel) {
      lVar4 = 0x46d;
      goto LAB_002a9dde;
    }
    if (cap_local == Int16) {
      lVar4 = 0x469;
      goto LAB_002a9dde;
    }
    if (cap_local != Int8) {
      return;
    }
    (this->features_).use_int8_type = true;
  }
  lVar4 = 0x46e;
LAB_002a9dde:
  *(undefined1 *)((long)&this->context_ + lVar4) = 1;
  return;
}

Assistant:

void ValidationState_t::RegisterCapability(spv::Capability cap) {
  // Avoid redundant work.  Otherwise the recursion could induce work
  // quadrdatic in the capability dependency depth. (Ok, not much, but
  // it's something.)
  if (module_capabilities_.contains(cap)) return;

  module_capabilities_.insert(cap);
  spv_operand_desc desc;
  if (SPV_SUCCESS == grammar_.lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                            uint32_t(cap), &desc)) {
    for (auto capability :
         CapabilitySet(desc->numCapabilities, desc->capabilities)) {
      RegisterCapability(capability);
    }
  }

  switch (cap) {
    case spv::Capability::Kernel:
      features_.group_ops_reduce_and_scans = true;
      break;
    case spv::Capability::Int8:
      features_.use_int8_type = true;
      features_.declare_int8_type = true;
      break;
    case spv::Capability::StorageBuffer8BitAccess:
    case spv::Capability::UniformAndStorageBuffer8BitAccess:
    case spv::Capability::StoragePushConstant8:
    case spv::Capability::WorkgroupMemoryExplicitLayout8BitAccessKHR:
      features_.declare_int8_type = true;
      break;
    case spv::Capability::Int16:
      features_.declare_int16_type = true;
      break;
    case spv::Capability::Float16:
    case spv::Capability::Float16Buffer:
      features_.declare_float16_type = true;
      break;
    case spv::Capability::StorageUniformBufferBlock16:
    case spv::Capability::StorageUniform16:
    case spv::Capability::StoragePushConstant16:
    case spv::Capability::StorageInputOutput16:
    case spv::Capability::WorkgroupMemoryExplicitLayout16BitAccessKHR:
      features_.declare_int16_type = true;
      features_.declare_float16_type = true;
      features_.free_fp_rounding_mode = true;
      break;
    case spv::Capability::VariablePointers:
    case spv::Capability::VariablePointersStorageBuffer:
      features_.variable_pointers = true;
      break;
    default:
      // TODO(dneto): For now don't validate SPV_NV_ray_tracing, which uses
      // capability spv::Capability::RayTracingNV.
      // spv::Capability::RayTracingProvisionalKHR would need the same
      // treatment. One of the differences going from SPV_KHR_ray_tracing from
      // provisional to final spec was the provisional spec uses Locations
      // for variables in certain storage classes, just like the
      // SPV_NV_ray_tracing extension.  So it mimics the NVIDIA extension.
      // The final SPV_KHR_ray_tracing uses a different capability token
      // number, so it doesn't fall into this case.
      break;
  }
}